

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::keyPressEvent(QGraphicsView *this,QKeyEvent *event)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QObject *pQVar4;
  
  lVar1 = *(long *)(this + 8);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x490));
  if ((bVar3) && ((*(byte *)(lVar1 + 0x300) & 1) != 0)) {
    lVar2 = *(long *)(lVar1 + 0x490);
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = *(QObject **)(lVar1 + 0x498);
    }
    QCoreApplication::sendEvent(pQVar4,(QEvent *)event);
    if (event[0xc] != (QKeyEvent)0x0) {
      return;
    }
  }
  QAbstractScrollArea::keyPressEvent((QAbstractScrollArea *)this,event);
  return;
}

Assistant:

void QGraphicsView::keyPressEvent(QKeyEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed) {
        QAbstractScrollArea::keyPressEvent(event);
        return;
    }
    QCoreApplication::sendEvent(d->scene, event);
    if (!event->isAccepted())
        QAbstractScrollArea::keyPressEvent(event);
}